

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O3

string * __thiscall
flatbuffers::dart::DartGenerator::GenDartTypeName
          (string *__return_storage_ptr__,DartGenerator *this,Type *type,
          Namespace *current_namespace,FieldDef *def,bool nullable,string *struct_type_suffix)

{
  pointer pcVar1;
  int iVar2;
  string local_50;
  
  pcVar1 = (struct_type_suffix->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + struct_type_suffix->_M_string_length);
  GenDartTypeName(__return_storage_ptr__,this,type,current_namespace,def,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (nullable) {
    iVar2 = std::__cxx11::string::compare((char *)__return_storage_ptr__);
    if (iVar2 != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenDartTypeName(const Type &type, Namespace *current_namespace,
                              const FieldDef &def, bool nullable,
                              std::string struct_type_suffix) {
    std::string typeName =
        GenDartTypeName(type, current_namespace, def, struct_type_suffix);
    if (nullable && typeName != "dynamic") typeName += "?";
    return typeName;
  }